

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O1

void lua_xmove(lua_State *L,lua_State *to,int n)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *pTVar3;
  int iVar4;
  
  if (L != to) {
    if ((long)((ulong)(to->maxstack).ptr32 - (long)to->top) <= (long)((ulong)(uint)n * 8)) {
      lj_state_growstack(to,n);
    }
    pTVar2 = L->top;
    pTVar3 = to->top;
    to->top = pTVar3 + n;
    if (0 < n) {
      pTVar3 = pTVar3 + n;
      iVar4 = n + 1;
      do {
        pTVar3 = pTVar3 + -1;
        pTVar1 = pTVar2 + -1;
        pTVar2 = pTVar2 + -1;
        *pTVar3 = *pTVar1;
        iVar4 = iVar4 + -1;
      } while (1 < iVar4);
    }
    L->top = pTVar2;
  }
  return;
}

Assistant:

LUA_API void lua_xmove(lua_State *L, lua_State *to, int n)
{
  TValue *f, *t;
  if (L == to) return;
  lj_checkapi_slot(n);
  lj_checkapi(G(L) == G(to), "move across global states");
  lj_state_checkstack(to, (MSize)n);
  f = L->top;
  t = to->top = to->top + n;
  while (--n >= 0) copyTV(to, --t, --f);
  L->top = f;
}